

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O2

void tif_11uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  byte *pbVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  
  for (uVar15 = 0; uVar15 < (length & 0xfffffffffffffff8); uVar15 = uVar15 + 8) {
    bVar1 = *pSrc;
    bVar2 = pSrc[1];
    bVar3 = pSrc[2];
    bVar4 = pSrc[3];
    bVar5 = pSrc[4];
    bVar6 = pSrc[5];
    bVar7 = pSrc[6];
    bVar8 = pSrc[7];
    bVar9 = pSrc[8];
    bVar10 = pSrc[9];
    bVar11 = pSrc[10];
    pSrc = pSrc + 0xb;
    pDst[uVar15] = (uint)(bVar2 >> 5) + (uint)bVar1 * 8;
    pDst[uVar15 + 1] = (uint)(bVar3 >> 2) | (bVar2 & 0x1f) << 6;
    pDst[uVar15 + 2] = (uint)(bVar5 >> 7) | (bVar3 & 3) * 0x200 + (uint)bVar4 * 2;
    pDst[uVar15 + 3] = (uint)(bVar6 >> 4) | (bVar5 & 0x7f) << 4;
    pDst[uVar15 + 4] = (uint)(bVar7 >> 1) | (bVar6 & 0xf) << 7;
    pDst[uVar15 + 5] = (uint)(bVar9 >> 6) | (bVar7 & 1) * 0x400 + (uint)bVar8 * 4;
    pDst[uVar15 + 6] = (uint)(bVar10 >> 3) | (bVar9 & 0x3f) << 5;
    pDst[uVar15 + 7] = (bVar10 & 7) << 8 | (uint)bVar11;
  }
  if ((length & 7) != 0) {
    bVar1 = pSrc[1];
    pDst[uVar15] = (uint)(bVar1 >> 5) + (uint)*pSrc * 8;
    uVar19 = (uint)(length & 7);
    if (uVar19 != 1) {
      pbVar16 = pSrc + 2;
      uVar14 = 0;
      iVar12 = 5;
      iVar18 = 0xb;
      while( true ) {
        uVar13 = (uint)bVar1;
        iVar17 = iVar18 - iVar12;
        if (iVar17 == 0 || iVar18 < iVar12) break;
        uVar14 = (uVar14 | uVar13 & ~(-1 << (sbyte)iVar12)) << ((byte)iVar17 & 0x1f);
        bVar1 = *pbVar16;
        pbVar16 = pbVar16 + 1;
        iVar12 = 8;
        iVar18 = iVar17;
      }
      iVar12 = iVar12 - iVar18;
      pDst[uVar15 + 1] =
           ~(-1 << ((byte)iVar18 & 0x1f)) & (uint)(bVar1 >> ((byte)iVar12 & 0x1f)) | uVar14;
      if (2 < uVar19) {
        uVar14 = 0;
        iVar17 = 0xb;
        iVar18 = 0xb;
        if (iVar12 != 0) goto LAB_0010faa9;
        while( true ) {
          iVar17 = iVar18;
          uVar13 = (uint)*pbVar16;
          pbVar16 = pbVar16 + 1;
          iVar12 = 8;
LAB_0010faa9:
          iVar18 = iVar17 - iVar12;
          if (iVar18 == 0 || iVar17 < iVar12) break;
          uVar14 = (uVar14 | uVar13 & ~(-1 << ((byte)iVar12 & 0x1f))) << ((byte)iVar18 & 0x1f);
        }
        iVar12 = iVar12 - iVar17;
        pDst[uVar15 + 2] = ~(-1 << ((byte)iVar17 & 0x1f)) & uVar13 >> ((byte)iVar12 & 0x1f) | uVar14
        ;
        if (uVar19 != 3) {
          uVar14 = 0;
          iVar17 = 0xb;
          iVar18 = 0xb;
          if (iVar12 != 0) goto LAB_0010fb0e;
          while( true ) {
            iVar17 = iVar18;
            uVar13 = (uint)*pbVar16;
            pbVar16 = pbVar16 + 1;
            iVar12 = 8;
LAB_0010fb0e:
            iVar18 = iVar17 - iVar12;
            if (iVar18 == 0 || iVar17 < iVar12) break;
            uVar14 = (uVar14 | uVar13 & ~(-1 << ((byte)iVar12 & 0x1f))) << ((byte)iVar18 & 0x1f);
          }
          iVar12 = iVar12 - iVar17;
          pDst[uVar15 + 3] =
               ~(-1 << ((byte)iVar17 & 0x1f)) & uVar13 >> ((byte)iVar12 & 0x1f) | uVar14;
          if (4 < uVar19) {
            uVar14 = 0;
            iVar17 = 0xb;
            iVar18 = 0xb;
            if (iVar12 != 0) goto LAB_0010fb73;
            while( true ) {
              iVar17 = iVar18;
              uVar13 = (uint)*pbVar16;
              pbVar16 = pbVar16 + 1;
              iVar12 = 8;
LAB_0010fb73:
              iVar18 = iVar17 - iVar12;
              if (iVar18 == 0 || iVar17 < iVar12) break;
              uVar14 = (uVar14 | uVar13 & ~(-1 << ((byte)iVar12 & 0x1f))) << ((byte)iVar18 & 0x1f);
            }
            iVar12 = iVar12 - iVar17;
            pDst[uVar15 + 4] =
                 ~(-1 << ((byte)iVar17 & 0x1f)) & uVar13 >> ((byte)iVar12 & 0x1f) | uVar14;
            if (uVar19 != 5) {
              uVar14 = 0;
              iVar17 = 0xb;
              iVar18 = 0xb;
              if (iVar12 != 0) goto LAB_0010fbd8;
              while( true ) {
                iVar17 = iVar18;
                uVar13 = (uint)*pbVar16;
                pbVar16 = pbVar16 + 1;
                iVar12 = 8;
LAB_0010fbd8:
                iVar18 = iVar17 - iVar12;
                if (iVar18 == 0 || iVar17 < iVar12) break;
                uVar14 = (uVar14 | uVar13 & ~(-1 << ((byte)iVar12 & 0x1f))) << ((byte)iVar18 & 0x1f)
                ;
              }
              iVar12 = iVar12 - iVar17;
              pDst[uVar15 + 5] =
                   ~(-1 << ((byte)iVar17 & 0x1f)) & uVar13 >> ((byte)iVar12 & 0x1f) | uVar14;
              if (uVar19 == 7) {
                uVar19 = 0;
                iVar17 = 0xb;
                iVar18 = 0xb;
                if (iVar12 != 0) goto LAB_0010fc39;
                while( true ) {
                  iVar17 = iVar18;
                  uVar13 = (uint)*pbVar16;
                  pbVar16 = pbVar16 + 1;
                  iVar12 = 8;
LAB_0010fc39:
                  iVar18 = iVar17 - iVar12;
                  if (iVar18 == 0 || iVar17 < iVar12) break;
                  uVar19 = (uVar19 | uVar13 & ~(-1 << ((byte)iVar12 & 0x1f))) <<
                           ((byte)iVar18 & 0x1f);
                }
                pDst[uVar15 + 6] =
                     ~(-1 << ((byte)iVar17 & 0x1f)) & uVar13 >> ((byte)iVar12 - (byte)iVar17 & 0x1f)
                     | uVar19;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void tif_11uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i+=8U) {
		OPJ_UINT32 val0 = *pSrc++;
		OPJ_UINT32 val1 = *pSrc++;
		OPJ_UINT32 val2 = *pSrc++;
		OPJ_UINT32 val3 = *pSrc++;
		OPJ_UINT32 val4 = *pSrc++;
		OPJ_UINT32 val5 = *pSrc++;
		OPJ_UINT32 val6 = *pSrc++;
		OPJ_UINT32 val7 = *pSrc++;
		OPJ_UINT32 val8 = *pSrc++;
		OPJ_UINT32 val9 = *pSrc++;
		OPJ_UINT32 val10 = *pSrc++;
		
		pDst[i+0] = (OPJ_INT32)((val0 << 3) | (val1 >> 5));
		pDst[i+1] = (OPJ_INT32)(((val1 & 0x1FU) << 6) | (val2 >> 2));
		pDst[i+2] = (OPJ_INT32)(((val2 & 0x3U) << 9) | (val3 << 1) | (val4 >> 7));
		pDst[i+3] = (OPJ_INT32)(((val4 & 0x7FU) << 4) | (val5 >> 4));
		pDst[i+4] = (OPJ_INT32)(((val5 & 0xFU) << 7) | (val6 >> 1));
		pDst[i+5] = (OPJ_INT32)(((val6 & 0x1U) << 10) | (val7 << 2) | (val8 >> 6));
		pDst[i+6] = (OPJ_INT32)(((val8 & 0x3FU) << 5) | (val9 >> 3));
		pDst[i+7] = (OPJ_INT32)(((val9 & 0x7U) << 8) | (val10));
		
	}
	if (length & 7U) {
		unsigned int val;
		int available = 0;
		
		length = length & 7U;
		
		GETBITS(pDst[i+0], 11)
		
		if (length > 1U) {
			GETBITS(pDst[i+1], 11)
			if (length > 2U) {
				GETBITS(pDst[i+2], 11)
				if (length > 3U) {
					GETBITS(pDst[i+3], 11)
					if (length > 4U) {
						GETBITS(pDst[i+4], 11)
						if (length > 5U) {
							GETBITS(pDst[i+5], 11)
							if (length > 6U) {
								GETBITS(pDst[i+6], 11)
							}
						}
					}
				}
			}
		}
	}
}